

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<int,kj::String>::Callbacks>::
insert<kj::HashMap<int,kj::String>::Entry,int&>
          (HashIndex<kj::HashMap<int,kj::String>::Callbacks> *this,
          ArrayPtr<kj::HashMap<int,_kj::String>::Entry> table,size_t pos,int *params)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  HashIndex<kj::HashMap<int,_kj::String>::Callbacks> *this_00;
  uint *puVar5;
  long lVar6;
  uint *in_R9;
  uint *puVar7;
  Maybe<unsigned_long> MVar8;
  
  this_00 = (HashIndex<kj::HashMap<int,_kj::String>::Callbacks> *)table.ptr;
  lVar3 = *(long *)(this_00 + 0x18);
  if ((ulong)(lVar3 * 2) < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    HashIndex<kj::HashMap<int,_kj::String>::Callbacks>::rehash(this_00,pos * 3 + 3);
    lVar3 = *(long *)(this_00 + 0x18);
  }
  uVar1 = *in_R9;
  uVar4 = uVar1 * 0x8000 + ~uVar1;
  uVar4 = (uVar4 >> 0xc ^ uVar4) * 5;
  uVar4 = (uVar4 >> 4 ^ uVar4) * 0x809;
  MVar8.ptr.field_1._0_4_ = uVar4 >> 0x10 ^ uVar4;
  uVar4 = (int)lVar3 - 1U & MVar8.ptr.field_1._0_4_;
  puVar5 = (uint *)0x0;
  do {
    puVar7 = (uint *)(*(long *)(this_00 + 0x10) + (ulong)uVar4 * 8);
    uVar2 = puVar7[1];
    if (uVar2 == 1) {
      if (puVar5 == (uint *)0x0) {
        puVar5 = puVar7;
      }
    }
    else {
      if (uVar2 == 0) {
        if (puVar5 != (uint *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          puVar7 = puVar5;
        }
        *(ulong *)puVar7 = ((ulong)MVar8.ptr.field_1._0_4_ | (long)params << 0x20) + 0x200000000;
        *this = (HashIndex<kj::HashMap<int,kj::String>::Callbacks>)0x0;
        goto LAB_001788aa;
      }
      if ((*puVar7 == MVar8.ptr.field_1._0_4_) &&
         (*(uint *)(table.size_ + (ulong)(uVar2 - 2) * 0x20) == uVar1)) {
        *this = (HashIndex<kj::HashMap<int,kj::String>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
LAB_001788aa:
        MVar8.ptr._0_8_ = this;
        MVar8.ptr.field_1.value._4_4_ = 0;
        return (Maybe<unsigned_long>)MVar8.ptr;
      }
    }
    lVar6 = (ulong)uVar4 + 1;
    uVar4 = (uint)lVar6;
    if (lVar6 == lVar3) {
      uVar4 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }